

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O1

void Psr_ManRemapBoxes(Bac_Man_t *pNew,Vec_Ptr_t *vDes,Psr_Ntk_t *pNtk,Vec_Int_t *vMap)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  char *pStr;
  uint uVar6;
  long lVar7;
  Psr_Ntk_t *pNtkBox;
  
  if (0 < (pNtk->vObjs).nSize) {
    lVar7 = 0;
    do {
      piVar3 = (pNtk->vObjs).pArray;
      iVar1 = piVar3[lVar7];
      if (((long)iVar1 < 0) || (iVar2 = (pNtk->vBoxes).nSize, iVar2 <= iVar1)) goto LAB_003b708d;
      piVar4 = (pNtk->vBoxes).pArray;
      Psr_BoxSignals_V._0_4_ = piVar4[iVar1] + -2;
      iVar1 = piVar3[lVar7];
      Psr_BoxSignals_V._4_4_ = Psr_BoxSignals_V._0_4_;
      if ((iVar1 < -3) || (iVar2 <= (int)(iVar1 + 3U))) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      Psr_BoxSignals_V._8_8_ = piVar4 + (iVar1 + 3U);
      if (*(int *)Psr_BoxSignals_V._8_8_ != 0) {
        if ((iVar1 < -1) || (iVar2 <= (int)(iVar1 + 1U))) {
LAB_003b708d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        pStr = Abc_NamStr(pNtk->pStrs,piVar4[iVar1 + 1U]);
        uVar5 = Abc_NamStrFind(pNew->pMods,pStr);
        if ((int)uVar5 < 1) {
          __assert_fail("NtkIdNew > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPrsBuild.c"
                        ,0x88,
                        "void Psr_ManRemapBoxes(Bac_Man_t *, Vec_Ptr_t *, Psr_Ntk_t *, Vec_Int_t *)"
                       );
        }
        if ((pNtk->vObjs).nSize <= lVar7) goto LAB_003b708d;
        iVar1 = (pNtk->vObjs).pArray[lVar7];
        if ((iVar1 < -1) || (uVar6 = iVar1 + 1, (pNtk->vBoxes).nSize <= (int)uVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pNtk->vBoxes).pArray[uVar6] = uVar5;
        if ((int)uVar5 <= pNew->nNtks) {
          if (vDes->nSize < (int)uVar5) {
            pNtkBox = (Psr_Ntk_t *)0x0;
          }
          else {
            pNtkBox = (Psr_Ntk_t *)vDes->pArray[(ulong)uVar5 - 1];
          }
          Psr_ManRemapOne((Vec_Int_t *)Psr_BoxSignals_V,pNtkBox,vMap);
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (pNtk->vObjs).nSize);
  }
  return;
}

Assistant:

void Psr_ManRemapBoxes( Bac_Man_t * pNew, Vec_Ptr_t * vDes, Psr_Ntk_t * pNtk, Vec_Int_t * vMap )
{
    Vec_Int_t * vSigs; int iBox;
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            int NtkId = Psr_BoxNtk( pNtk, iBox );
            int NtkIdNew = Bac_ManNtkFindId( pNew, Psr_NtkStr(pNtk, NtkId) );
            assert( NtkIdNew > 0 );
            Psr_BoxSetNtk( pNtk, iBox, NtkIdNew );
            if ( NtkIdNew <= Bac_ManNtkNum(pNew) )
                Psr_ManRemapOne( vSigs, Psr_ManNtk(vDes, NtkIdNew-1), vMap );
            //else
            //    Psr_ManRemapGate( vSigs );
        }
}